

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O3

aiMesh * __thiscall
Assimp::IRRImporter::BuildSingleQuadMesh
          (IRRImporter *this,SkyboxVertex *v1,SkyboxVertex *v2,SkyboxVertex *v3,SkyboxVertex *v4)

{
  float fVar1;
  aiMesh *paVar2;
  undefined8 *puVar3;
  void *pvVar4;
  aiVector3D *paVar5;
  uint i;
  long lVar6;
  
  paVar2 = (aiMesh *)operator_new(0x520);
  lVar6 = 0;
  paVar2->mNumVertices = 0;
  memset(&paVar2->mVertices,0,0xcc);
  paVar2->mBones = (aiBone **)0x0;
  paVar2->mMaterialIndex = 0;
  (paVar2->mName).length = 0;
  (paVar2->mName).data[0] = '\0';
  memset((paVar2->mName).data + 1,0x1b,0x3ff);
  paVar2->mNumAnimMeshes = 0;
  paVar2->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar2->mMethod = 0;
  (paVar2->mAABB).mMin.x = 0.0;
  (paVar2->mAABB).mMin.y = 0.0;
  (paVar2->mAABB).mMin.z = 0.0;
  (paVar2->mAABB).mMax.x = 0.0;
  (paVar2->mAABB).mMax.y = 0.0;
  (paVar2->mAABB).mMax.z = 0.0;
  memset(paVar2->mColors,0,0xa0);
  paVar2->mPrimitiveTypes = 8;
  paVar2->mNumFaces = 1;
  puVar3 = (undefined8 *)operator_new__(0x18);
  *puVar3 = 1;
  puVar3[2] = 0;
  paVar2->mFaces = (aiFace *)(puVar3 + 1);
  *(undefined4 *)(puVar3 + 1) = 4;
  pvVar4 = operator_new__(0x10);
  puVar3[2] = pvVar4;
  do {
    *(int *)(puVar3[2] + lVar6 * 4) = (int)lVar6;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  paVar2->mNumVertices = 4;
  paVar5 = (aiVector3D *)operator_new__(0x30);
  paVar2->mVertices = paVar5;
  paVar5->z = (v1->position).z;
  fVar1 = (v1->position).y;
  paVar5->x = (v1->position).x;
  paVar5->y = fVar1;
  paVar5[1].z = (v2->position).z;
  fVar1 = (v2->position).y;
  paVar5[1].x = (v2->position).x;
  paVar5[1].y = fVar1;
  fVar1 = (v3->position).y;
  paVar5[2].x = (v3->position).x;
  paVar5[2].y = fVar1;
  paVar5[2].z = (v3->position).z;
  fVar1 = (v4->position).y;
  paVar5[3].x = (v4->position).x;
  paVar5[3].y = fVar1;
  paVar5[3].z = (v4->position).z;
  paVar5 = (aiVector3D *)operator_new__(0x30);
  paVar2->mNormals = paVar5;
  paVar5->z = (v1->normal).z;
  fVar1 = (v1->normal).y;
  paVar5->x = (v1->normal).x;
  paVar5->y = fVar1;
  paVar5[1].z = (v2->normal).z;
  fVar1 = (v2->normal).y;
  paVar5[1].x = (v2->normal).x;
  paVar5[1].y = fVar1;
  fVar1 = (v3->normal).y;
  paVar5[2].x = (v3->normal).x;
  paVar5[2].y = fVar1;
  paVar5[2].z = (v3->normal).z;
  fVar1 = (v4->normal).y;
  paVar5[3].x = (v4->normal).x;
  paVar5[3].y = fVar1;
  paVar5[3].z = (v4->normal).z;
  paVar5 = (aiVector3D *)operator_new__(0x30);
  paVar2->mTextureCoords[0] = paVar5;
  paVar5->z = (v1->uv).z;
  fVar1 = (v1->uv).y;
  paVar5->x = (v1->uv).x;
  paVar5->y = fVar1;
  paVar5[1].z = (v2->uv).z;
  fVar1 = (v2->uv).y;
  paVar5[1].x = (v2->uv).x;
  paVar5[1].y = fVar1;
  fVar1 = (v3->uv).y;
  paVar5[2].x = (v3->uv).x;
  paVar5[2].y = fVar1;
  paVar5[2].z = (v3->uv).z;
  fVar1 = (v4->uv).y;
  paVar5[3].x = (v4->uv).x;
  paVar5[3].y = fVar1;
  paVar5[3].z = (v4->uv).z;
  return paVar2;
}

Assistant:

aiMesh* IRRImporter::BuildSingleQuadMesh(const SkyboxVertex& v1,
    const SkyboxVertex& v2,
    const SkyboxVertex& v3,
    const SkyboxVertex& v4)
{
    // allocate and prepare the mesh
    aiMesh* out = new aiMesh();

    out->mPrimitiveTypes = aiPrimitiveType_POLYGON;
    out->mNumFaces = 1;

    // build the face
    out->mFaces    = new aiFace[1];
    aiFace& face   = out->mFaces[0];

    face.mNumIndices = 4;
    face.mIndices    = new unsigned int[4];
    for (unsigned int i = 0; i < 4;++i)
        face.mIndices[i] = i;

    out->mNumVertices = 4;

    // copy vertex positions
    aiVector3D* vec = out->mVertices = new aiVector3D[4];
    *vec++ = v1.position;
    *vec++ = v2.position;
    *vec++ = v3.position;
    *vec   = v4.position;

    // copy vertex normals
    vec = out->mNormals = new aiVector3D[4];
    *vec++ = v1.normal;
    *vec++ = v2.normal;
    *vec++ = v3.normal;
    *vec   = v4.normal;

    // copy texture coordinates
    vec = out->mTextureCoords[0] = new aiVector3D[4];
    *vec++ = v1.uv;
    *vec++ = v2.uv;
    *vec++ = v3.uv;
    *vec   = v4.uv;
    return out;
}